

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

uint32 * __thiscall Js::IndexPropertyDescriptorMap::CopyIndexList(IndexPropertyDescriptorMap *this)

{
  int iVar1;
  Recycler *pRVar2;
  uint **ppuVar3;
  int local_54;
  int i;
  TrackAllocData local_40;
  uint *local_18;
  uint32 *newList;
  IndexPropertyDescriptorMap *this_local;
  
  pRVar2 = this->recycler;
  newList = (uint32 *)this;
  iVar1 = Count(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&unsigned_int::typeinfo,0,(long)iVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
             ,0x1f);
  pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_40);
  iVar1 = Count(this);
  local_18 = Memory::AllocateArray<Memory::Recycler,unsigned_int,false>
                       ((Memory *)pRVar2,(Recycler *)Memory::Recycler::AllocLeaf,0,(long)iVar1);
  local_54 = 0;
  while( true ) {
    iVar1 = Count(this);
    if (iVar1 <= local_54) break;
    ppuVar3 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_int__
                        ((WriteBarrierPtr *)&this->indexList);
    local_18[local_54] = (*ppuVar3)[local_54];
    local_54 = local_54 + 1;
  }
  return local_18;
}

Assistant:

uint32 * IndexPropertyDescriptorMap::CopyIndexList() const
    {
        uint32 * newList = RecyclerNewArrayLeaf(recycler, uint32, Count());
        for (int i = 0; i < Count(); i++)
        {
            newList[i] = this->indexList[i];
        }
        return newList;
    }